

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * print_object(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char *__s;
  bool bVar1;
  int iVar2;
  cJSON *pcVar3;
  char *pcVar4;
  void *__s_00;
  void *__s_01;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int needed;
  size_t __n;
  cJSON *item_00;
  bool bVar13;
  int local_64;
  int local_40;
  
  item_00 = (cJSON *)&item->child;
  __n = 0xfffffffffffffff8;
  uVar11 = 0;
  pcVar3 = item_00;
  do {
    pcVar3 = pcVar3->next;
    uVar11 = uVar11 - 1;
    __n = __n + 8;
  } while (pcVar3 != (cJSON *)0x0);
  if ((int)uVar11 == -1) {
    if (p == (printbuffer *)0x0) {
      iVar9 = 3;
      if (fmt != 0) {
        iVar9 = depth + 4;
      }
      pcVar4 = (char *)(*cJSON_malloc)((long)iVar9);
    }
    else {
      iVar9 = 3;
      if (fmt != 0) {
        iVar9 = depth + 4;
      }
      pcVar4 = ensure(p,iVar9);
    }
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '{';
      if (fmt == 0) {
        pcVar6 = pcVar4 + 1;
      }
      else {
        pcVar6 = pcVar4 + 2;
        pcVar4[1] = '\n';
        iVar9 = 1;
        if (1 < depth) {
          iVar9 = depth;
        }
        while (iVar9 + -1 != 0) {
          *pcVar6 = '\t';
          pcVar6 = pcVar6 + 1;
          iVar9 = iVar9 + -1;
        }
      }
      pcVar6[0] = '}';
      pcVar6[1] = '\0';
      return pcVar4;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (*cJSON_malloc)(__n);
    if (__s_00 != (void *)0x0) {
      __s_01 = (*cJSON_malloc)(__n);
      if (__s_01 != (void *)0x0) {
        uVar5 = ~uVar11;
        lVar10 = 0;
        memset(__s_00,0,__n);
        memset(__s_01,0,__n);
        local_64 = 7;
        if (fmt != 0) {
          local_64 = depth + 8;
        }
        iVar9 = depth + 5;
        if (fmt == 0) {
          iVar9 = 2;
        }
        bVar13 = false;
        while (bVar1 = bVar13, item_00 = item_00->next, item_00 != (cJSON *)0x0) {
          pcVar4 = print_string_ptr(item_00->string,(printbuffer *)0x0);
          *(char **)((long)__s_01 + lVar10 * 8) = pcVar4;
          pcVar6 = print_value(item_00,depth + 1,fmt,(printbuffer *)0x0);
          *(char **)((long)__s_00 + lVar10 * 8) = pcVar6;
          lVar10 = lVar10 + 1;
          bVar13 = true;
          if (pcVar6 != (char *)0x0 && pcVar4 != (char *)0x0) {
            sVar7 = strlen(pcVar6);
            sVar8 = strlen(pcVar4);
            local_40 = (int)sVar7;
            local_64 = local_64 + iVar9 + (int)sVar8 + local_40;
            bVar13 = bVar1;
          }
        }
        if ((!bVar1) &&
           (pcVar4 = (char *)(*cJSON_malloc)((long)local_64), pcVar4 != (char *)0x0 && !bVar1)) {
          *pcVar4 = '{';
          if (fmt == 0) {
            pcVar6 = pcVar4 + 1;
          }
          else {
            pcVar6 = pcVar4 + 2;
            pcVar4[1] = '\n';
          }
          *pcVar6 = '\0';
          for (uVar5 = 0; ~uVar11 != uVar5; uVar5 = uVar5 + 1) {
            if (fmt != 0) {
              for (lVar10 = 0; (int)lVar10 <= depth; lVar10 = lVar10 + 1) {
                pcVar6[lVar10] = '\t';
              }
              pcVar6 = pcVar6 + lVar10;
            }
            __s = *(char **)((long)__s_01 + uVar5 * 8);
            sVar7 = strlen(__s);
            memcpy(pcVar6,__s,sVar7);
            pcVar6[sVar7] = ':';
            if (fmt == 0) {
              lVar10 = sVar7 + 1;
            }
            else {
              pcVar6[sVar7 + 1] = '\t';
              lVar10 = sVar7 + 2;
            }
            strcpy(pcVar6 + lVar10,*(char **)((long)__s_00 + uVar5 * 8));
            sVar7 = strlen(*(char **)((long)__s_00 + uVar5 * 8));
            pcVar6 = pcVar6 + lVar10 + sVar7;
            if (uVar5 != -(int)uVar11 - 2) {
              *pcVar6 = ',';
              pcVar6 = pcVar6 + 1;
            }
            if (fmt != 0) {
              *pcVar6 = '\n';
              pcVar6 = pcVar6 + 1;
            }
            *pcVar6 = '\0';
            (*cJSON_free)(*(void **)((long)__s_01 + uVar5 * 8));
            (*cJSON_free)(*(void **)((long)__s_00 + uVar5 * 8));
          }
          (*cJSON_free)(__s_01);
          (*cJSON_free)(__s_00);
          if (fmt != 0) {
            iVar9 = 0;
            if (0 < depth) {
              iVar9 = depth;
            }
            while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
              *pcVar6 = '\t';
              pcVar6 = pcVar6 + 1;
            }
          }
          pcVar6[0] = '}';
          pcVar6[1] = '\0';
          return pcVar4;
        }
        lVar10 = 0;
        while (bVar13 = uVar5 != 0, uVar5 = uVar5 - 1, bVar13) {
          if (*(void **)((long)__s_01 + lVar10) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_01 + lVar10));
          }
          if (*(void **)((long)__s_00 + lVar10) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_00 + lVar10));
          }
          lVar10 = lVar10 + 8;
        }
        (*cJSON_free)(__s_01);
      }
      (*cJSON_free)(__s_00);
    }
  }
  else {
    iVar9 = p->offset;
    pcVar4 = ensure(p,(fmt != 0) + 2);
    if (pcVar4 != (char *)0x0) {
      iVar12 = (fmt != 0) + 1;
      *pcVar4 = '{';
      if (fmt == 0) {
        pcVar4 = pcVar4 + 1;
      }
      else {
        pcVar4[1] = '\n';
        pcVar4 = pcVar4 + 2;
      }
      *pcVar4 = '\0';
      p->offset = p->offset + iVar12;
      needed = depth + 1;
      while (item_00 = item_00->next, item_00 != (cJSON *)0x0) {
        if (fmt != 0) {
          pcVar4 = ensure(p,needed);
          if (pcVar4 == (char *)0x0) {
            return (char *)0x0;
          }
          for (lVar10 = 0; (int)lVar10 <= depth; lVar10 = lVar10 + 1) {
            pcVar4[lVar10] = '\t';
          }
          p->offset = p->offset + needed;
        }
        print_string_ptr(item_00->string,p);
        iVar2 = update(p);
        p->offset = iVar2;
        pcVar4 = ensure(p,iVar12);
        if (pcVar4 == (char *)0x0) {
          return (char *)0x0;
        }
        *pcVar4 = ':';
        if (fmt != 0) {
          pcVar4[1] = '\t';
        }
        p->offset = p->offset + iVar12;
        print_value(item_00,needed,fmt,p);
        iVar2 = update(p);
        p->offset = iVar2;
        iVar2 = ((fmt != 0) + 1) - (uint)(item_00->next == (cJSON *)0x0);
        pcVar4 = ensure(p,iVar2 + 1);
        if (pcVar4 == (char *)0x0) {
          return (char *)0x0;
        }
        if (item_00->next != (cJSON *)0x0) {
          *pcVar4 = ',';
          pcVar4 = pcVar4 + 1;
        }
        if (fmt != 0) {
          *pcVar4 = '\n';
          pcVar4 = pcVar4 + 1;
        }
        *pcVar4 = '\0';
        p->offset = p->offset + iVar2;
      }
      iVar12 = 2;
      if (fmt != 0) {
        iVar12 = depth + 2;
      }
      pcVar4 = ensure(p,iVar12);
      if (pcVar4 != (char *)0x0) {
        if (fmt != 0) {
          iVar12 = 0;
          iVar9 = 0;
          if (0 < depth) {
            iVar12 = depth;
            iVar9 = depth;
          }
          while (iVar12 != 0) {
            *pcVar4 = '\t';
            pcVar4 = pcVar4 + 1;
            iVar12 = iVar12 + -1;
          }
        }
        pcVar4[0] = '}';
        pcVar4[1] = '\0';
        return p->buffer + iVar9;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	size_t tmplen=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Explicitly handle empty object case */
	if (!numentries)
	{
		if (p) out=ensure(p,fmt?depth+4:3);
		else	out=(char*)cJSON_malloc(fmt?depth+4:3);
		if (!out)	return 0;
		ptr=out;*ptr++='{';
		if (fmt) {*ptr++='\n';for (i=0;i<depth-1;i++) *ptr++='\t';}
		*ptr++='}';*ptr++=0;
		return out;
	}
	if (p)
	{
		/* Compose the output: */
		i=p->offset;
		len=fmt?2:1;	ptr=ensure(p,len+1);	if (!ptr) return 0;
		*ptr++='{';	if (fmt) *ptr++='\n';	*ptr=0;	p->offset+=len;
		child=item->child;depth++;
		while (child)
		{
			if (fmt)
			{
				ptr=ensure(p,depth);	if (!ptr) return 0;
				for (j=0;j<depth;j++) *ptr++='\t';
				p->offset+=depth;
			}
			print_string_ptr(child->string,p);
			p->offset=update(p);
			
			len=fmt?2:1;
			ptr=ensure(p,len);	if (!ptr) return 0;
			*ptr++=':';if (fmt) *ptr++='\t';
			p->offset+=len;
			
			print_value(child,depth,fmt,p);
			p->offset=update(p);

			len=(fmt?1:0)+(child->next?1:0);
			ptr=ensure(p,len+1); if (!ptr) return 0;
			if (child->next) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			p->offset+=len;
			child=child->next;
		}
		ptr=ensure(p,fmt?(depth+1):2);	 if (!ptr) return 0;
		if (fmt)	for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate space for the names and the objects */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		names=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!names) {cJSON_free(entries);return 0;}
		memset(entries,0,sizeof(char*)*numentries);
		memset(names,0,sizeof(char*)*numentries);

		/* Collect all the results into our arrays: */
		child=item->child;depth++;if (fmt) len+=depth;
		while (child)
		{
			names[i]=str=print_string_ptr(child->string,0);
			entries[i++]=ret=print_value(child,depth,fmt,0);
			if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
			child=child->next;
		}
		
		/* Try to allocate the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		if (!out) fail=1;

		/* Handle failure */
		if (fail)
		{
			for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
			cJSON_free(names);cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output: */
		*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
		for (i=0;i<numentries;i++)
		{
			if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
			tmplen=strlen(names[i]);memcpy(ptr,names[i],tmplen);ptr+=tmplen;
			*ptr++=':';if (fmt) *ptr++='\t';
			strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
			if (i!=numentries-1) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			cJSON_free(names[i]);cJSON_free(entries[i]);
		}
		
		cJSON_free(names);cJSON_free(entries);
		if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr++=0;
	}
	return out;	
}